

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

int Mop_ManReadParams(char *pBuffer,int *pnIns,int *pnOuts)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int local_44;
  char *pcStack_40;
  int nCubes;
  char *pStr;
  char *pOuts;
  char *pIns;
  int *pnOuts_local;
  int *pnIns_local;
  char *pBuffer_local;
  
  pcVar2 = strstr(pBuffer,".i ");
  pcVar3 = strstr(pBuffer,".o ");
  local_44 = 0;
  if ((pcVar2 == (char *)0x0) || (pcVar3 == (char *)0x0)) {
    pBuffer_local._4_4_ = -1;
  }
  else {
    iVar1 = atoi(pcVar2 + 2);
    *pnIns = iVar1;
    iVar1 = atoi(pcVar3 + 2);
    *pnOuts = iVar1;
    for (pcStack_40 = pBuffer; *pcStack_40 != '\0'; pcStack_40 = pcStack_40 + 1) {
      local_44 = (uint)(*pcStack_40 == '\n') + local_44;
    }
    pBuffer_local._4_4_ = local_44;
  }
  return pBuffer_local._4_4_;
}

Assistant:

int Mop_ManReadParams( char * pBuffer, int * pnIns, int * pnOuts )
{
    char * pIns  = strstr( pBuffer, ".i " );
    char * pOuts = strstr( pBuffer, ".o " );
    char * pStr  = pBuffer; int nCubes = 0;
    if ( pIns == NULL || pOuts == NULL )
        return -1;
    *pnIns  = atoi( pIns + 2 );
    *pnOuts = atoi( pOuts + 2 );
    while ( *pStr )
        nCubes += (*pStr++ == '\n');
    return nCubes;
}